

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f __thiscall Quat4f::normalized(Quat4f *this)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  Quat4f QVar2;
  
  uVar1 = in_RSI[1];
  *(undefined8 *)this->m_elements = *in_RSI;
  *(undefined8 *)(this->m_elements + 2) = uVar1;
  normalize(this);
  QVar2.m_elements[1] = (float)extraout_XMM0_Db;
  QVar2.m_elements[0] = (float)extraout_XMM0_Da;
  QVar2.m_elements[2] = (float)(int)in_XMM1_Qa;
  QVar2.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Quat4f)QVar2.m_elements;
}

Assistant:

Quat4f Quat4f::normalized() const
{
	Quat4f q( *this );
	q.normalize();
	return q;
}